

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O2

void __thiscall
ImplDispatchTest_AEAD_AES_GCM_Test::TestBody(ImplDispatchTest_AEAD_AES_GCM_Test *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  initializer_list<std::pair<unsigned_long,_bool>_> __l;
  allocator_type local_d1;
  pair<unsigned_long,_bool> local_d0;
  undefined8 local_c0;
  byte local_b8;
  undefined8 local_b0;
  byte local_a8;
  undefined8 local_a0;
  byte local_98;
  undefined8 local_90;
  byte local_88;
  undefined8 local_80;
  byte local_78;
  undefined8 local_70;
  byte local_68;
  undefined8 local_60;
  byte local_58;
  _Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
  local_50;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_b8 = (this->super_ImplDispatchTest).aesni_;
  bVar1 = (this->super_ImplDispatchTest).vaes_;
  local_98 = bVar1 ^ 1;
  bVar2 = (this->super_ImplDispatchTest).is_x86_64_;
  local_d0.second = (bool)1;
  if ((bVar2 & 1U) != 0) {
    local_d0.second = (bool)local_98;
  }
  if ((bool)local_b8 == false) {
    local_d0.second = false;
  }
  local_d0.first = 0;
  local_c0 = 1;
  local_b0 = 3;
  if (((this->super_ImplDispatchTest).avx_movbe_ & 1U) == 0) {
    local_98 = 0;
  }
  if ((local_b8 & 1) == 0) {
    local_98 = 0;
  }
  if ((bVar2 & 1U) == 0) {
    local_98 = 0;
  }
  local_a0 = 2;
  local_88 = local_b8 ^ 1;
  if ((this->super_ImplDispatchTest).ssse3_ == false) {
    local_88 = 0;
  }
  local_90 = 4;
  local_80 = 5;
  if ((bVar2 & 1U) == 0) {
    local_68 = 0;
    local_58 = 0;
  }
  else {
    bVar2 = (this->super_ImplDispatchTest).avx512_;
    bVar3 = (this->super_ImplDispatchTest).avoid_zmm_;
    local_68 = 1;
    if ((bVar2 & 1U) != 0) {
      local_68 = bVar3;
    }
    if ((bVar1 & 1U) == 0) {
      local_68 = 0;
      local_58 = 0;
    }
    else {
      local_58 = 0;
      if ((bVar2 & 1U) != 0) {
        local_58 = bVar3 ^ 1;
      }
    }
  }
  local_70 = 6;
  local_60 = 7;
  __l._M_len = 8;
  __l._M_array = &local_d0;
  local_a8 = local_b8;
  local_78 = local_88;
  std::vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  vector((vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_> *
         )&local_50,__l,&local_d1);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/impl_dispatch_test.cc:116:7)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/impl_dispatch_test.cc:116:7)>
             ::_M_manager;
  ImplDispatchTest::AssertFunctionsHit
            (&this->super_ImplDispatchTest,
             (vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
              *)&local_50,(function<void_()> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::
  _Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  ~_Vector_base(&local_50);
  return;
}

Assistant:

TEST_F(ImplDispatchTest, AEAD_AES_GCM) {
  AssertFunctionsHit(
      {
          {kFlag_aes_hw_ctr32_encrypt_blocks, aesni_ && !(is_x86_64_ && vaes_)},
          {kFlag_aes_hw_encrypt, aesni_},
          {kFlag_aes_hw_set_encrypt_key, aesni_},
          {kFlag_aesni_gcm_encrypt,
           is_x86_64_ && aesni_ && avx_movbe_ && !vaes_},
          {kFlag_vpaes_encrypt, ssse3_ && !aesni_},
          {kFlag_vpaes_set_encrypt_key, ssse3_ && !aesni_},
          {kFlag_aes_gcm_enc_update_vaes_avx2,
           is_x86_64_ && vaes_ && !(avx512_ && !avoid_zmm_)},
          {kFlag_aes_gcm_enc_update_vaes_avx512,
           is_x86_64_ && vaes_ && avx512_ && !avoid_zmm_},
      },
      [] {
        const uint8_t kZeros[16] = {0};
        const uint8_t kPlaintext[40] = {1, 2, 3, 4, 0};
        uint8_t ciphertext[sizeof(kPlaintext) + 16];
        size_t ciphertext_len;
        bssl::ScopedEVP_AEAD_CTX ctx;
        ASSERT_TRUE(EVP_AEAD_CTX_init(ctx.get(), EVP_aead_aes_128_gcm(), kZeros,
                                      sizeof(kZeros),
                                      EVP_AEAD_DEFAULT_TAG_LENGTH, nullptr));
        ASSERT_TRUE(EVP_AEAD_CTX_seal(
            ctx.get(), ciphertext, &ciphertext_len, sizeof(ciphertext), kZeros,
            EVP_AEAD_nonce_length(EVP_aead_aes_128_gcm()), kPlaintext,
            sizeof(kPlaintext), nullptr, 0));
      });
}